

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::CharTrie::IsDepthOne(CharTrie *this)

{
  bool bVar1;
  int local_1c;
  int i;
  CharTrie *this_local;
  
  if ((this->isAccepting & 1U) == 0) {
    for (local_1c = 0; local_1c < this->count; local_1c = local_1c + 1) {
      bVar1 = IsDepthZero(&this->children[local_1c].node);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CharTrie::IsDepthOne() const
    {
        if (isAccepting)
            return 0;
        for (int i = 0; i < count; i++)
        {
            if (!children[i].node.IsDepthZero())
                return false;
        }
        return true;
    }